

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall
JsonString_Utf16HighWithNoLowSurrogate_Test::TestBody
          (JsonString_Utf16HighWithNoLowSurrogate_Test *this)

{
  bool bVar1;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_00;
  error_code *lhs;
  char *pcVar2;
  extensions in_ECX;
  error_code eVar3;
  AssertHelper local_120;
  Message local_118;
  coord local_110;
  coord local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8;
  error_code local_e0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  undefined1 local_b0 [8];
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  JsonString_Utf16HighWithNoLowSurrogate_Test *this_local;
  
  p.coordinate_ = (coord)this;
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0,
             (json *)&(this->super_JsonString).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x0,
             in_ECX);
  this_00 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0,
                       "\"\\uD834\\u30A1\"");
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_00);
  lhs = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::last_error
                  ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0);
  eVar3 = pstore::json::make_error_code(bad_unicode_code_point);
  local_e0._M_cat = eVar3._M_cat;
  local_e0._M_value = eVar3._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_d0,"p.last_error ()",
             "make_error_code (json::error_code::bad_unicode_code_point)",lhs,&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_string.cpp"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_108 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::coordinate
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0);
  pstore::json::coord::coord(&local_110,0xd,1);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_100,"p.coordinate ()","(json::coord{13U, 1U})",&local_108,&local_110)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_string.cpp"
               ,0xa6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0);
  return;
}

Assistant:

TEST_F (JsonString, Utf16HighWithNoLowSurrogate) {
    // UTF-16 high surrogate followed by non-surrogate UTF-16 hex code point.
    auto p = json::make_parser (proxy_);
    p.input (R"("\uD834\u30A1")").eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::bad_unicode_code_point));
    EXPECT_EQ (p.coordinate (), (json::coord{13U, 1U}));
}